

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O1

int asn1_template_noexp_d2i
              (ASN1_VALUE **val,uchar **in,long len,ASN1_TEMPLATE *tt,char opt,CRYPTO_BUFFER *buf,
              int depth)

{
  bool bVar1;
  uchar *puVar2;
  uint aclass;
  uint uVar3;
  size_t sVar4;
  OPENSSL_STACK *pOVar5;
  int line;
  int iVar6;
  stack_st_ASN1_VALUE *sktmp;
  OPENSSL_STACK *sk;
  uchar *p;
  ASN1_VALUE *vtmp;
  uchar **local_40;
  long len_local;
  
  uVar3 = tt->flags;
  aclass = uVar3 & 0xc0;
  p = *in;
  local_40 = in;
  len_local = len;
  if ((uVar3 & 6) == 0) {
    if ((uVar3 & 8) == 0) {
      iVar6 = asn1_item_ex_d2i(val,&p,len,tt->item,-1,0,opt,buf,depth);
      if (iVar6 == -1) {
        return -1;
      }
      line = 600;
    }
    else {
      iVar6 = asn1_item_ex_d2i(val,&p,len,tt->item,tt->tag,aclass,opt,buf,depth);
      if (iVar6 == -1) {
        return -1;
      }
      line = 0x24e;
    }
    if (iVar6 != 0) goto LAB_00209f69;
    ERR_put_error(0xc,0,0x9e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,line);
  }
  else {
    if ((uVar3 & 8) == 0) {
      iVar6 = 0x11 - (uint)((uVar3 & 2) == 0);
      aclass = 0;
    }
    else {
      iVar6 = tt->tag;
    }
    uVar3 = asn1_check_tlen(&len_local,(int *)0x0,(uchar *)0x0,(char *)0x0,&p,len,iVar6,aclass,opt);
    sk = (OPENSSL_STACK *)(ulong)uVar3;
    iVar6 = 1;
    if (uVar3 != 0xffffffff) {
      if (uVar3 == 0) {
        sk = (OPENSSL_STACK *)0x0;
        ERR_put_error(0xc,0,0x9e,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x224);
      }
      else {
        sk = (OPENSSL_STACK *)*val;
        if (sk == (OPENSSL_STACK *)0x0) {
          pOVar5 = OPENSSL_sk_new_null();
          *val = (ASN1_VALUE *)pOVar5;
        }
        else {
          sVar4 = OPENSSL_sk_num(sk);
          if (sVar4 != 0) {
            do {
              vtmp = (ASN1_VALUE *)OPENSSL_sk_pop(sk);
              ASN1_item_ex_free((ASN1_VALUE **)&vtmp,(ASN1_ITEM *)tt->item);
              sVar4 = OPENSSL_sk_num(sk);
            } while (sVar4 != 0);
          }
        }
        if (*val == (ASN1_VALUE *)0x0) {
          iVar6 = 4;
        }
        else {
          do {
            puVar2 = p;
            if (len_local < 1) {
              iVar6 = 0;
              break;
            }
            vtmp = (ASN1_VALUE *)0x0;
            iVar6 = asn1_item_ex_d2i(&vtmp,&p,len_local,tt->item,-1,0,'\0',buf,depth);
            if (iVar6 == 0) {
              bVar1 = false;
              ERR_put_error(0xc,0,0x9e,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                            ,0x240);
              iVar6 = 4;
            }
            else {
              len_local = (long)(puVar2 + (len_local - (long)p));
              sVar4 = OPENSSL_sk_push((OPENSSL_STACK *)*val,vtmp);
              if (sVar4 == 0) {
                ASN1_item_ex_free((ASN1_VALUE **)&vtmp,(ASN1_ITEM *)tt->item);
                iVar6 = 4;
                bVar1 = false;
              }
              else {
                iVar6 = 0;
                bVar1 = true;
              }
            }
          } while (bVar1);
        }
      }
    }
    if (iVar6 == 0) {
LAB_00209f69:
      *local_40 = p;
      return 1;
    }
    if (iVar6 != 4) {
      return (int)sk;
    }
  }
  ASN1_template_free((ASN1_VALUE **)val,(ASN1_TEMPLATE *)tt);
  return 0;
}

Assistant:

static int asn1_template_noexp_d2i(ASN1_VALUE **val, const unsigned char **in,
                                   long len, const ASN1_TEMPLATE *tt, char opt,
                                   CRYPTO_BUFFER *buf, int depth) {
  int aclass;
  int ret;
  const unsigned char *p;
  if (!val) {
    return 0;
  }
  uint32_t flags = tt->flags;
  aclass = flags & ASN1_TFLG_TAG_CLASS;

  p = *in;

  if (flags & ASN1_TFLG_SK_MASK) {
    // SET OF, SEQUENCE OF
    int sktag, skaclass;
    // First work out expected inner tag value
    if (flags & ASN1_TFLG_IMPTAG) {
      sktag = tt->tag;
      skaclass = aclass;
    } else {
      skaclass = V_ASN1_UNIVERSAL;
      if (flags & ASN1_TFLG_SET_OF) {
        sktag = V_ASN1_SET;
      } else {
        sktag = V_ASN1_SEQUENCE;
      }
    }
    // Get the tag
    ret =
        asn1_check_tlen(&len, NULL, NULL, NULL, &p, len, sktag, skaclass, opt);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    } else if (ret == -1) {
      return -1;
    }
    if (!*val) {
      *val = (ASN1_VALUE *)sk_ASN1_VALUE_new_null();
    } else {
      // We've got a valid STACK: free up any items present
      STACK_OF(ASN1_VALUE) *sktmp = (STACK_OF(ASN1_VALUE) *)*val;
      ASN1_VALUE *vtmp;
      while (sk_ASN1_VALUE_num(sktmp) > 0) {
        vtmp = sk_ASN1_VALUE_pop(sktmp);
        ASN1_item_ex_free(&vtmp, ASN1_ITEM_ptr(tt->item));
      }
    }

    if (!*val) {
      goto err;
    }

    // Read as many items as we can
    while (len > 0) {
      ASN1_VALUE *skfield;
      const unsigned char *q = p;
      skfield = NULL;
      if (!asn1_item_ex_d2i(&skfield, &p, len, ASN1_ITEM_ptr(tt->item),
                            /*tag=*/-1, /*aclass=*/0, /*opt=*/0, buf, depth)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }
      len -= p - q;
      if (!sk_ASN1_VALUE_push((STACK_OF(ASN1_VALUE) *)*val, skfield)) {
        ASN1_item_ex_free(&skfield, ASN1_ITEM_ptr(tt->item));
        goto err;
      }
    }
  } else if (flags & ASN1_TFLG_IMPTAG) {
    // IMPLICIT tagging
    ret = asn1_item_ex_d2i(val, &p, len, ASN1_ITEM_ptr(tt->item), tt->tag,
                           aclass, opt, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      goto err;
    } else if (ret == -1) {
      return -1;
    }
  } else {
    // Nothing special
    ret = asn1_item_ex_d2i(val, &p, len, ASN1_ITEM_ptr(tt->item), /*tag=*/-1,
                           /*aclass=*/0, opt, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      goto err;
    } else if (ret == -1) {
      return -1;
    }
  }

  *in = p;
  return 1;

err:
  ASN1_template_free(val, tt);
  return 0;
}